

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

void ReleaseJsRTContext_TTDCallback(FinalizableObject *jsrtCtx)

{
  Memory::Recycler::RootRelease
            (*(Recycler **)
              (*(long *)(jsrtCtx[1].super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x92]
                        + 0x3b8) + 0x588),jsrtCtx,(uint *)0x0);
  JsrtContext::OnReplayDisposeContext_TTDCallback(jsrtCtx);
  return;
}

Assistant:

void CALLBACK ReleaseJsRTContext_TTDCallback(FinalizableObject* jsrtCtx)
{
    static_cast<JsrtContext*>(jsrtCtx)->GetScriptContext()->GetThreadContext()->GetRecycler()->RootRelease(jsrtCtx);
    JsrtContext::OnReplayDisposeContext_TTDCallback(jsrtCtx);
}